

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,char *filename,int type)

{
  size_t sVar1;
  int iVar2;
  FILE *__s;
  known_host *node;
  size_t sVar3;
  char *errmsg;
  LIBSSH2_SESSION *session;
  int iStack_1050;
  size_t wrote;
  char buffer [4092];
  
  if (type == 1) {
    __s = fopen(filename,"w");
    if (__s != (FILE *)0x0) {
      node = (known_host *)_libssh2_list_first(&hosts->head);
      do {
        if (node == (known_host *)0x0) {
          iVar2 = 0;
LAB_0011a99a:
          fclose(__s);
          return iVar2;
        }
        wrote = 0;
        iVar2 = knownhost_writeline(hosts,node,buffer,0xffc,&wrote,1);
        sVar1 = wrote;
        if (iVar2 != 0) goto LAB_0011a99a;
        sVar3 = fwrite(buffer,1,wrote,__s);
        if (sVar3 != sVar1) {
          iVar2 = _libssh2_error(hosts->session,-0x10,"Write failed");
          goto LAB_0011a99a;
        }
        node = (known_host *)_libssh2_list_next(&node->node);
      } while( true );
    }
    session = hosts->session;
    errmsg = "Failed to open file";
    iStack_1050 = -0x10;
  }
  else {
    session = hosts->session;
    errmsg = "Unsupported type of known-host information store";
    iStack_1050 = -0x21;
  }
  iVar2 = _libssh2_error(session,iStack_1050,errmsg);
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,
                            const char *filename, int type)
{
    struct known_host *node;
    FILE *file;
    int rc = LIBSSH2_ERROR_NONE;
    char buffer[4092];

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    file = fopen(filename, FOPEN_WRITETEXT);
    if(!file)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                              "Failed to open file");

    for(node = _libssh2_list_first(&hosts->head);
        node;
        node = _libssh2_list_next(&node->node)) {
        size_t wrote = 0;
        size_t nwrote;
        rc = knownhost_writeline(hosts, node, buffer, sizeof(buffer), &wrote,
                                 type);
        if(rc)
            break;

        nwrote = fwrite(buffer, 1, wrote, file);
        if(nwrote != wrote) {
            /* failed to write the whole thing, bail out */
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                                "Write failed");
            break;
        }
    }
    fclose(file);

    return rc;
}